

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O3

Box * __thiscall
amrex::MFIter::grownnodaltilebox(Box *__return_storage_ptr__,MFIter *this,int dir,IntVect *a_ng)

{
  IntVect local_18;
  
  if (dir < 0) {
    local_18.vect[0] = 1;
    local_18.vect[1] = 1;
    local_18.vect[2] = 1;
  }
  else if (dir == 0) {
    local_18.vect[0] = 1;
    local_18.vect[1] = 0;
    local_18.vect[2] = 0;
  }
  else if (dir == 1) {
    local_18.vect[2] = 0;
    local_18.vect[0] = 0;
    local_18.vect[1] = 1;
  }
  else {
    local_18.vect[2] = 1;
    local_18.vect[0] = 0;
    local_18.vect[1] = 0;
  }
  tilebox(__return_storage_ptr__,this,&local_18,a_ng);
  return __return_storage_ptr__;
}

Assistant:

Box
MFIter::grownnodaltilebox (int dir, IntVect const& a_ng) const noexcept
{
    BL_ASSERT(dir < AMREX_SPACEDIM);
    if (dir < 0) return tilebox(IntVect::TheNodeVector(), a_ng);
    return tilebox(IntVect::TheDimensionVector(dir), a_ng);
}